

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

MetaDataFlags flagsFromStMode(mode_t mode,quint64 attributes)

{
  uint in_EDI;
  long in_FS_OFFSET;
  MetaDataFlags entryFlags;
  MetaDataFlag in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
            );
  if ((in_EDI & 0x100) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,OwnerReadPermission);
  }
  if ((in_EDI & 0x80) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,OwnerWritePermission);
  }
  if ((in_EDI & 0x40) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,OwnerExecutePermission);
  }
  if ((in_EDI & 0x20) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,GroupReadPermission);
  }
  if ((in_EDI & 0x10) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,GroupWritePermission);
  }
  if ((in_EDI & 8) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,GroupExecutePermission);
  }
  if ((in_EDI & 4) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,OtherReadPermission);
  }
  if ((in_EDI & 2) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,OtherWritePermission);
  }
  if ((in_EDI & 1) != 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,OtherExecutePermission);
  }
  if ((in_EDI & 0xf000) == 0x8000) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,FileType);
  }
  else if ((in_EDI & 0xf000) == 0x4000) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,DirectoryType);
  }
  else if ((in_EDI & 0xf000) != 0x6000) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_c,SequentialType);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)local_c.i;
}

Assistant:

static QFileSystemMetaData::MetaDataFlags
flagsFromStMode(mode_t mode, [[maybe_unused]] quint64 attributes)
{
    // inode exists
    QFileSystemMetaData::MetaDataFlags entryFlags = QFileSystemMetaData::ExistsAttribute;

    if (mode & S_IRUSR)
        entryFlags |= QFileSystemMetaData::OwnerReadPermission;
    if (mode & S_IWUSR)
        entryFlags |= QFileSystemMetaData::OwnerWritePermission;
    if (mode & S_IXUSR)
        entryFlags |= QFileSystemMetaData::OwnerExecutePermission;

    if (mode & S_IRGRP)
        entryFlags |= QFileSystemMetaData::GroupReadPermission;
    if (mode & S_IWGRP)
        entryFlags |= QFileSystemMetaData::GroupWritePermission;
    if (mode & S_IXGRP)
        entryFlags |= QFileSystemMetaData::GroupExecutePermission;

    if (mode & S_IROTH)
        entryFlags |= QFileSystemMetaData::OtherReadPermission;
    if (mode & S_IWOTH)
        entryFlags |= QFileSystemMetaData::OtherWritePermission;
    if (mode & S_IXOTH)
        entryFlags |= QFileSystemMetaData::OtherExecutePermission;

    // Type
    Q_ASSERT(!S_ISLNK(mode));   // can only happen with lstat()
    if ((mode & S_IFMT) == S_IFREG)
        entryFlags |= QFileSystemMetaData::FileType;
    else if ((mode & S_IFMT) == S_IFDIR)
        entryFlags |= QFileSystemMetaData::DirectoryType;
    else if ((mode & S_IFMT) != S_IFBLK)    // char devices, sockets, FIFOs
        entryFlags |= QFileSystemMetaData::SequentialType;

    // OS-specific flags
    // Potential flags for the future:
    // UF_APPEND and STATX_ATTR_APPEND
    // UF_COMPRESSED and STATX_ATTR_COMPRESSED
    // UF_IMMUTABLE and STATX_ATTR_IMMUTABLE
    // UF_NODUMP and STATX_ATTR_NODUMP
#ifdef UF_HIDDEN
    if (attributes & UF_HIDDEN)
        entryFlags |= QFileSystemMetaData::HiddenAttribute;
#elif defined(Q_OS_VXWORKS) && __has_include(<dosFsLib.h>)
    if (attributes & DOS_ATTR_RDONLY) {
        // on a DOS FS, stat() always returns 0777 bits set in st_mode
        // when DOS FS is read only the write permissions are removed
        entryFlags &= ~QFileSystemMetaData::OwnerWritePermission;
        entryFlags &= ~QFileSystemMetaData::GroupWritePermission;
        entryFlags &= ~QFileSystemMetaData::OtherWritePermission;
    }
#endif
    return entryFlags;
}